

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  StorageIndex *pSVar4;
  StorageIndex *pSVar5;
  Index IVar6;
  Index IVar7;
  StorageIndex *pSVar8;
  Scalar *pSVar9;
  Index IVar10;
  Index IVar11;
  SparseMatrix<double,_0,_int> *pSVar12;
  void *__ptr;
  undefined8 *puVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  SparseMatrix<double,_0,_int> local_88;
  SparseMatrix<double,_0,_int> *local_40;
  long local_38;
  
  local_38 = *(long *)(other + 8);
  local_88.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_88.m_outerSize = 0;
  local_88.m_innerSize = 0;
  local_88.m_outerIndex = (StorageIndex *)0x0;
  local_88.m_innerNonZeros = (StorageIndex *)0x0;
  local_88.m_data.m_values = (Scalar *)0x0;
  local_88.m_data.m_indices = (StorageIndex *)0x0;
  local_88.m_data.m_size = 0;
  local_88.m_data.m_allocatedSize = 0;
  SparseMatrix<double,_0,_int>::resize
            (&local_88,*(Index *)(local_38 + 8),*(Index *)(local_38 + 0x10));
  pSVar4 = local_88.m_outerIndex;
  IVar6 = local_88.m_outerSize;
  uVar14 = local_88.m_outerSize;
  if ((((ulong)local_88.m_outerIndex & 3) == 0) &&
     (uVar14 = (ulong)(-((uint)((ulong)local_88.m_outerIndex >> 2) & 0x3fffffff) & 3),
     local_88.m_outerSize <= (long)uVar14)) {
    uVar14 = local_88.m_outerSize;
  }
  uVar24 = local_88.m_outerSize - uVar14;
  uVar16 = uVar24 + 3;
  if (-1 < (long)uVar24) {
    uVar16 = uVar24;
  }
  local_40 = (SparseMatrix<double,_0,_int> *)this;
  if (0 < (long)uVar14) {
    memset(local_88.m_outerIndex,0,uVar14 * 4);
  }
  lVar18 = (uVar16 & 0xfffffffffffffffc) + uVar14;
  if (3 < (long)uVar24) {
    lVar22 = uVar14 + 4;
    if ((long)(uVar14 + 4) < lVar18) {
      lVar22 = lVar18;
    }
    memset(pSVar4 + uVar14,0,(~uVar14 + lVar22 & 0xfffffffffffffffc) * 4 + 0x10);
  }
  lVar22 = IVar6 - lVar18;
  if (lVar22 != 0 && lVar18 <= IVar6) {
    memset(pSVar4 + ((long)uVar16 >> 2) * 4 + uVar14,0,lVar22 * 4);
  }
  lVar22 = local_38;
  IVar6 = local_88.m_outerSize;
  lVar18 = *(long *)(local_38 + 8);
  if (0 < lVar18) {
    lVar1 = *(long *)(local_38 + 0x30);
    lVar2 = *(long *)(local_38 + 0x18);
    lVar3 = *(long *)(local_38 + 0x20);
    lVar19 = 0;
    do {
      lVar20 = (long)*(int *)(lVar2 + lVar19 * 4);
      if (lVar3 == 0) {
        lVar21 = (long)*(int *)(lVar2 + 4 + lVar19 * 4);
      }
      else {
        lVar21 = *(int *)(lVar3 + lVar19 * 4) + lVar20;
      }
      if (lVar20 < lVar21) {
        do {
          local_88.m_outerIndex[*(int *)(lVar1 + lVar20 * 4)] =
               local_88.m_outerIndex[*(int *)(lVar1 + lVar20 * 4)] + 1;
          lVar20 = lVar20 + 1;
        } while (lVar21 != lVar20);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar18);
  }
  iVar17 = 0;
  if (local_88.m_outerSize != 0) {
    if ((ulong)local_88.m_outerSize >> 0x3e == 0) {
      __ptr = malloc(local_88.m_outerSize * 4);
      if (__ptr != (void *)0x0) goto LAB_0014313d;
    }
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar13 = std::streambuf::xsgetn;
    __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __ptr = (void *)0x0;
LAB_0014313d:
  if (0 < IVar6) {
    uVar14 = 0;
    iVar15 = 0;
    do {
      iVar17 = local_88.m_outerIndex[uVar14] + iVar15;
      local_88.m_outerIndex[uVar14] = iVar15;
      *(int *)((long)__ptr + uVar14 * 4) = iVar15;
      uVar14 = uVar14 + 1;
      iVar15 = iVar17;
    } while (IVar6 != uVar14);
  }
  local_88.m_outerIndex[IVar6] = iVar17;
  internal::CompressedStorage<double,_int>::resize(&local_88.m_data,(long)iVar17,0.0);
  pSVar12 = local_40;
  lVar18 = *(long *)(lVar22 + 8);
  if (0 < lVar18) {
    lVar1 = *(long *)(lVar22 + 0x28);
    lVar2 = *(long *)(lVar22 + 0x30);
    lVar3 = *(long *)(lVar22 + 0x18);
    lVar22 = *(long *)(lVar22 + 0x20);
    lVar19 = 0;
    do {
      lVar20 = (long)*(int *)(lVar3 + lVar19 * 4);
      if (lVar22 == 0) {
        lVar21 = (long)*(int *)(lVar3 + 4 + lVar19 * 4);
      }
      else {
        lVar21 = *(int *)(lVar22 + lVar19 * 4) + lVar20;
      }
      if (lVar20 < lVar21) {
        do {
          lVar23 = (long)*(int *)(lVar2 + lVar20 * 4);
          iVar17 = *(int *)((long)__ptr + lVar23 * 4);
          *(int *)((long)__ptr + lVar23 * 4) = iVar17 + 1;
          local_88.m_data.m_indices[iVar17] = (StorageIndex)lVar19;
          local_88.m_data.m_values[iVar17] = *(Scalar *)(lVar1 + lVar20 * 8);
          lVar20 = lVar20 + 1;
        } while (lVar21 != lVar20);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar18);
  }
  pSVar4 = local_40->m_outerIndex;
  IVar6 = local_40->m_outerSize;
  IVar7 = local_40->m_innerSize;
  local_40->m_outerSize = local_88.m_outerSize;
  local_40->m_innerSize = local_88.m_innerSize;
  pSVar5 = (local_40->m_data).m_indices;
  pSVar8 = local_40->m_innerNonZeros;
  pSVar9 = (local_40->m_data).m_values;
  local_40->m_outerIndex = local_88.m_outerIndex;
  local_40->m_innerNonZeros = local_88.m_innerNonZeros;
  (local_40->m_data).m_values = local_88.m_data.m_values;
  (local_40->m_data).m_indices = local_88.m_data.m_indices;
  IVar10 = (local_40->m_data).m_size;
  IVar11 = (local_40->m_data).m_allocatedSize;
  (local_40->m_data).m_size = local_88.m_data.m_size;
  (local_40->m_data).m_allocatedSize = local_88.m_data.m_allocatedSize;
  local_88.m_outerSize = IVar6;
  local_88.m_innerSize = IVar7;
  local_88.m_outerIndex = pSVar4;
  local_88.m_innerNonZeros = pSVar8;
  local_88.m_data.m_values = pSVar9;
  local_88.m_data.m_indices = pSVar5;
  local_88.m_data.m_size = IVar10;
  local_88.m_data.m_allocatedSize = IVar11;
  free(__ptr);
  free(pSVar4);
  free(local_88.m_innerNonZeros);
  internal::CompressedStorage<double,_int>::~CompressedStorage(&local_88.m_data);
  return pSVar12;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_StorageIndex>& SparseMatrix<Scalar,_Options,_StorageIndex>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)

  #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
    EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
  #endif
      
  const bool needToTranspose = (Flags & RowMajorBit) != (internal::evaluator<OtherDerived>::Flags & RowMajorBit);
  if (needToTranspose)
  {
    #ifdef EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
      EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
    #endif
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested_eval<OtherDerived,2,typename internal::plain_matrix_type<OtherDerived>::type >::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    typedef internal::evaluator<_OtherCopy> OtherCopyEval;
    OtherCopy otherCopy(other.derived());
    OtherCopyEval otherCopyEval(otherCopy);

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<IndexVector> (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    StorageIndex count = 0;
    IndexVector positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      StorageIndex tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (StorageIndex j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
    {
      initAssignment(other.derived());
    }
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}